

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_set_quantize_method(fitsfile *fptr,int method,int *status)

{
  int iVar1;
  
  if (method - 3U < 0xfffffffc) {
    ffpmsg("illegal dithering value (fits_set_quantize_method)");
    *status = 0x19d;
    iVar1 = 0x19d;
  }
  else {
    fptr->Fptr->request_quantize_method = method + (uint)(method == 0);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_set_quantize_method(fitsfile *fptr,  /* I - FITS file pointer   */
           int method,          /* quantization method       */
           int *status)         /* IO - error status                */
{
/*
   This routine specifies what type of dithering (randomization) should
   be performed when quantizing floating point images to integer prior to
   compression.   A value of -1 means do no dithering.  A value of 0 means
   use the default SUBTRACTIVE_DITHER_1 (which is equivalent to dither = 1).
   A value of 2 means use SUBTRACTIVE_DITHER_2.
*/

    if (method < -1 || method > 2)
    {
	ffpmsg("illegal dithering value (fits_set_quantize_method)");
	*status = DATA_COMPRESSION_ERR; 
    } else {
       
        if (method == 0) method = 1;
        (fptr->Fptr)->request_quantize_method = method;
    }

    return(*status);
}